

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

unsigned_long ENTROPY_DEBUG(char *label,unsigned_long entropy)

{
  int iVar1;
  char *__s1;
  
  __s1 = getenv("EXPAT_ENTROPY_DEBUG");
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,"1");
    if (iVar1 == 0) {
      fprintf(_stderr,"Entropy: %s --> 0x%0*lx (%lu bytes)\n",label,0x10,entropy,8);
    }
  }
  return entropy;
}

Assistant:

static unsigned long
ENTROPY_DEBUG(const char * label, unsigned long entropy) {
  const char * const EXPAT_ENTROPY_DEBUG = getenv("EXPAT_ENTROPY_DEBUG");
  if (EXPAT_ENTROPY_DEBUG && ! strcmp(EXPAT_ENTROPY_DEBUG, "1")) {
    fprintf(stderr, "Entropy: %s --> 0x%0*lx (%lu bytes)\n",
        label,
        (int)sizeof(entropy) * 2, entropy,
        (unsigned long)sizeof(entropy));
  }
  return entropy;
}